

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProtocolTCP.cpp
# Opt level: O1

TCPConnection * __thiscall ProtocolTCP::NewServer(ProtocolTCP *this,InterfaceMAC *mac,uint16_t port)

{
  long lVar1;
  
  lVar1 = 0;
  do {
    if (*(int *)(&this->field_0x0 + lVar1) == 0) {
      TCPConnection::Allocate((TCPConnection *)(&this->field_0x0 + lVar1),mac);
      *(undefined4 *)(&this->field_0x0 + lVar1) = 1;
      *(uint16_t *)(&this->field_0x4 + lVar1) = port;
      return (TCPConnection *)(&this->field_0x0 + lVar1);
    }
    lVar1 = lVar1 + 0x370;
  } while (lVar1 != 0x1130);
  return (TCPConnection *)0x0;
}

Assistant:

TCPConnection* ProtocolTCP::NewServer(InterfaceMAC* mac, uint16_t port)
{
    int i;

    for (i = 0; i < TCP_MAX_CONNECTIONS; i++)
    {
        TCPConnection& connection = ConnectionList[i];
        if (connection.State == TCPConnection::CLOSED)
        {
            connection.Allocate(mac);
            connection.State = TCPConnection::LISTEN;
            connection.LocalPort = port;
            return &connection;
        }
    }

    return nullptr;
}